

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::InnerProduct3D_1D::dim_forward
          (Dim *__return_storage_ptr__,InnerProduct3D_1D *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint uVar2;
  pointer pDVar3;
  int iVar4;
  long lVar5;
  invalid_argument *piVar6;
  long lVar7;
  uint uVar8;
  ostringstream s;
  string local_1b0 [32];
  undefined8 local_190 [47];
  
  pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pDVar3;
  if (((lVar5 >> 2) * -0x71c71c71c71c71c7 & 0xfffffffffffffffeU) != 2) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar6,"Expected two or three arguments in InnerProduct3D_1D");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((pDVar3->nd != 3) || (pDVar3[1].nd != 1)) || (pDVar3->d[2] != pDVar3[1].d[0])) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Bad input dimensions in InnerProduct3D_1D: ",0x2b);
    operator<<((ostream *)local_190,xs);
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar6,local_1b0);
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_190[0] = *(undefined8 *)pDVar3->d;
  uVar1 = pDVar3->bd;
  uVar2 = pDVar3[1].bd;
  __return_storage_ptr__->nd = 0;
  if (uVar2 < uVar1) {
    uVar2 = uVar1;
  }
  lVar7 = 0;
  __return_storage_ptr__->bd = uVar2;
  do {
    uVar1 = __return_storage_ptr__->nd;
    uVar2 = *(uint *)((long)local_190 + lVar7);
    lVar7 = lVar7 + 4;
    __return_storage_ptr__->nd = uVar1 + 1;
    __return_storage_ptr__->d[uVar1] = uVar2;
  } while (lVar7 != 8);
  if (lVar5 != 0x6c) {
    return __return_storage_ptr__;
  }
  uVar1 = pDVar3[2].bd;
  uVar2 = __return_storage_ptr__->bd;
  uVar8 = uVar1;
  if (uVar1 < uVar2) {
    uVar8 = uVar2;
  }
  __return_storage_ptr__->bd = uVar8;
  if (((pDVar3[2].nd == __return_storage_ptr__->nd) && (uVar2 <= uVar1)) &&
     (iVar4 = bcmp(pDVar3 + 2,__return_storage_ptr__,(ulong)pDVar3[2].nd), iVar4 == 0)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Bad input dimensions in InnerProduct3D_1D: ",0x2b);
  operator<<((ostream *)local_190,xs);
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar6,local_1b0);
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim InnerProduct3D_1D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 && xs.size() != 3)
    throw std::invalid_argument("Expected two or three arguments in InnerProduct3D_1D");
  if (xs[0].ndims() != 3 ||
      xs[1].ndims() != 1 ||
      xs[0].size(2) != xs[1].size(0)) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d({xs[0].size(0), xs[0].size(1)}, max(xs[0].bd, xs[1].bd));
  if(xs.size() == 3) d.bd = max(d.bd, xs[2].bd);
  if (xs.size() == 3 && xs[2] != d) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  return d;
}